

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

bool __thiscall
PType::AddConversion
          (PType *this,PType *target,
          _func_void_ZCC_ExprConstant_ptr_FSharedStringArena_ptr *convertconst)

{
  uint uVar1;
  ulong uVar2;
  Conversion *pCVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (ulong)(this->Conversions).Count;
  if (uVar2 == 0) {
LAB_0037a04d:
    TArray<PType::Conversion,_PType::Conversion>::Grow(&this->Conversions,1);
    pCVar3 = (this->Conversions).Array;
    uVar1 = (this->Conversions).Count;
    pCVar3[uVar1].TargetType = target;
    pCVar3[uVar1].ConvertConstant = convertconst;
    (this->Conversions).Count = uVar1 + 1;
    bVar5 = true;
  }
  else {
    pCVar3 = (this->Conversions).Array;
    if (pCVar3->TargetType == target) {
      bVar5 = false;
    }
    else {
      uVar4 = 0;
      do {
        pCVar3 = pCVar3 + 1;
        if (uVar2 - 1 == uVar4) goto LAB_0037a04d;
        uVar4 = uVar4 + 1;
      } while (pCVar3->TargetType != target);
      bVar5 = uVar2 <= uVar4;
    }
  }
  return bVar5;
}

Assistant:

bool PType::AddConversion(PType *target, void (*convertconst)(ZCC_ExprConstant *, class FSharedStringArena &))
{
	// Make sure a conversion hasn't already been registered
	for (unsigned i = 0; i < Conversions.Size(); ++i)
	{
		if (Conversions[i].TargetType == target)
			return false;
	}
	Conversions.Push(Conversion(target, convertconst));
	return true;
}